

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQInteger sq_getsize(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType type;
  SQObjectPtr *pSVar1;
  SQClass *pSVar2;
  _HashNode *p_Var3;
  
  pSVar1 = stack_get(v,idx);
  type = (pSVar1->super_SQObject)._type;
  if (type == OT_INSTANCE) {
    pSVar2 = ((pSVar1->super_SQObject)._unVal.pClass)->_base;
LAB_001097be:
    p_Var3 = (_HashNode *)pSVar2->_udsize;
  }
  else {
    if (type != OT_ARRAY) {
      if (type == OT_CLASS) {
        pSVar2 = (pSVar1->super_SQObject)._unVal.pClass;
        goto LAB_001097be;
      }
      if (type == OT_TABLE) {
        return ((pSVar1->super_SQObject)._unVal.pTable)->_usednodes;
      }
      if (type != OT_USERDATA) {
        if (type == OT_STRING) {
          return (SQInteger)
                 (((pSVar1->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                 _sharedstate;
        }
        sq_aux_invalidtype(v,type);
        return -1;
      }
    }
    p_Var3 = ((pSVar1->super_SQObject)._unVal.pTable)->_firstfree;
  }
  return (SQInteger)p_Var3;
}

Assistant:

SQInteger sq_getsize(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectType type = sq_type(o);
    switch(type) {
    case OT_STRING:     return _string(o)->_len;
    case OT_TABLE:      return _table(o)->CountUsed();
    case OT_ARRAY:      return _array(o)->Size();
    case OT_USERDATA:   return _userdata(o)->_size;
    case OT_INSTANCE:   return _instance(o)->_class->_udsize;
    case OT_CLASS:      return _class(o)->_udsize;
    default:
        return sq_aux_invalidtype(v, type);
    }
}